

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

bool __thiscall libcellml::Annotator::assignAllIds(Annotator *this)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  AnnotatorImpl *pAVar3;
  bool bVar4;
  shared_ptr<libcellml::Model> model;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  pLVar2 = Logger::pFunc(&this->super_Logger);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if (local_20._M_ptr == (element_type *)0x0) {
    pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
    AnnotatorImpl::addIssueNoModel(pAVar3);
    bVar4 = false;
  }
  else {
    pLVar2 = Logger::pFunc(&this->super_Logger);
    puVar1 = pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
    AnnotatorImpl::doSetAllAutomaticIds(pAVar3);
    pLVar2 = Logger::pFunc(&this->super_Logger);
    bVar4 = puVar1 < pLVar2[1].mMessages.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return bVar4;
}

Assistant:

bool Annotator::assignAllIds()
{
    auto model = pFunc()->mModel.lock();
    if (model != nullptr) {
        size_t initialSize = pFunc()->idCount();
        pFunc()->doSetAllAutomaticIds();
        return pFunc()->idCount() > initialSize;
    }
    pFunc()->addIssueNoModel();
    return false;
}